

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_symbol_toString(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue v;
  JSValue JVar1;
  JSValue local_38;
  
  v = js_thisSymbolValue(ctx,this_val);
  JVar1 = v;
  if ((int)v.tag != 6) {
    local_38 = v;
    JVar1 = js_string_constructor(ctx,(JSValue)(ZEXT816(3) << 0x40),1,&local_38);
    JS_FreeValue(ctx,v);
  }
  return JVar1;
}

Assistant:

static JSValue js_symbol_toString(JSContext *ctx, JSValueConst this_val,
                                  int argc, JSValueConst *argv)
{
    JSValue val, ret;
    val = js_thisSymbolValue(ctx, this_val);
    if (JS_IsException(val))
        return val;
    /* XXX: use JS_ToStringInternal() with a flags */
    ret = js_string_constructor(ctx, JS_UNDEFINED, 1, (JSValueConst *)&val);
    JS_FreeValue(ctx, val);
    return ret;
}